

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_Z.c
# Opt level: O2

void test_small(char *name)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  archive_conflict *a;
  char *pcVar5;
  time_t tVar6;
  dev_t dVar7;
  la_int64_t lVar8;
  archive_entry *ae;
  
  extract_reference_file(name);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                   ,L'T',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,name,0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Z',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 512)",a)
  ;
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'_',".","\".\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  wVar2 = archive_entry_atime_is_set(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'`',0,"0",(long)wVar2,"archive_entry_atime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'a',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  wVar2 = archive_entry_birthtime_is_set(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'b',0,"0",(long)wVar2,"archive_entry_birthtime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'c',0,"0",tVar6,"archive_entry_birthtime(ae)",(void *)0x0);
  wVar2 = archive_entry_ctime_is_set(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'd',0,"0",(long)wVar2,"archive_entry_ctime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'e',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  dVar7 = archive_entry_dev(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'f',0,"0",dVar7,"archive_entry_dev(ae)",a);
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'g',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",a);
  lVar8 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'h',0,"0",lVar8,"archive_entry_gid(ae)",a);
  pcVar5 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'i',(char *)0x0,"NULL",pcVar5,"archive_entry_gname(ae)",a,L'\0');
  lVar8 = archive_entry_ino(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'j',0,"0",lVar8,"archive_entry_ino(ae)",a);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'k',0x41c0,"AE_IFDIR | 0700",(ulong)mVar3,"archive_entry_mode(ae)",a);
  wVar2 = archive_entry_mtime_is_set(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'l',0,"0",(long)wVar2,"archive_entry_mtime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'm',0,"0",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'n',4,"4",(ulong)uVar4,"archive_entry_nlink(ae)",a);
  mVar3 = archive_entry_perm(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'o',0x1c0,"0700",(ulong)mVar3,"archive_entry_perm(ae)",a);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'p',0x800,"2048",lVar8,"archive_entry_size(ae)",a);
  lVar8 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'q',0,"0",lVar8,"archive_entry_uid(ae)",a);
  pcVar5 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'r',(char *)0x0,"NULL",pcVar5,"archive_entry_uname(ae)",a,L'\0');
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'w',"A","\"A\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'x',0x4e489c1e,"1313381406",tVar6,"archive_entry_atime(ae)",a);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'y',0,"0",tVar6,"archive_entry_birthtime(ae)",a);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'z',0x4e489c1e,"1313381406",tVar6,"archive_entry_ctime(ae)",a);
  dVar7 = archive_entry_dev(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'{',0,"0",dVar7,"archive_entry_dev(ae)",a);
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'|',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",a);
  lVar8 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'}',0,"0",lVar8,"archive_entry_gid(ae)",a);
  pcVar5 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'~',(char *)0x0,"NULL",pcVar5,"archive_entry_gname(ae)",a,L'\0');
  lVar8 = archive_entry_ino(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x7f',0,"0",lVar8,"archive_entry_ino(ae)",a);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x80',0x41c0,"AE_IFDIR | 0700",(ulong)mVar3,"archive_entry_mode(ae)",a);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x81',0x4e489c1e,"1313381406",tVar6,"archive_entry_mtime(ae)",a);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x82',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",a);
  mVar3 = archive_entry_perm(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x83',0x1c0,"0700",(ulong)mVar3,"archive_entry_perm(ae)",a);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x84',0x800,"2048",lVar8,"archive_entry_size(ae)",a);
  lVar8 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x85',0,"0",lVar8,"archive_entry_uid(ae)",a);
  pcVar5 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'\x86',(char *)0x0,"NULL",pcVar5,"archive_entry_uname(ae)",a,L'\0');
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x8a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'\x8b',"A/B","\"A/B\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x8c',0x4e489c1e,"1313381406",tVar6,"archive_entry_atime(ae)",a);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x8d',0,"0",tVar6,"archive_entry_birthtime(ae)",a);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x8e',0x4e489c1e,"1313381406",tVar6,"archive_entry_ctime(ae)",a);
  dVar7 = archive_entry_dev(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x8f',0,"0",dVar7,"archive_entry_dev(ae)",a);
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x90',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",a);
  lVar8 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x91',0,"0",lVar8,"archive_entry_gid(ae)",a);
  pcVar5 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'\x92',(char *)0x0,"NULL",pcVar5,"archive_entry_gname(ae)",a,L'\0');
  lVar8 = archive_entry_ino(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x93',0,"0",lVar8,"archive_entry_ino(ae)",a);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x94',0x8100,"AE_IFREG | 0400",(ulong)mVar3,"archive_entry_mode(ae)",a);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x95',0x4e489c1e,"1313381406",tVar6,"archive_entry_mtime(ae)",a);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x96',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",a);
  mVar3 = archive_entry_perm(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x97',0x100,"0400",(ulong)mVar3,"archive_entry_perm(ae)",a);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x98',6,"6",lVar8,"archive_entry_size(ae)",a);
  lVar8 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x99',0,"0",lVar8,"archive_entry_uid(ae)",a);
  pcVar5 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'\x9a',(char *)0x0,"NULL",pcVar5,"archive_entry_uname(ae)",a,L'\0');
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\x9f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'\xa0',"C","\"C\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¡',0x4e489c23,"1313381411",tVar6,"archive_entry_atime(ae)",a);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¢',0,"0",tVar6,"archive_entry_birthtime(ae)",a);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'£',0x4e489c23,"1313381411",tVar6,"archive_entry_ctime(ae)",a);
  dVar7 = archive_entry_dev(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¤',0,"0",dVar7,"archive_entry_dev(ae)",a);
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¥',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",a);
  lVar8 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¦',0,"0",lVar8,"archive_entry_gid(ae)",a);
  pcVar5 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'§',(char *)0x0,"NULL",pcVar5,"archive_entry_gname(ae)",a,L'\0');
  lVar8 = archive_entry_ino(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¨',0,"0",lVar8,"archive_entry_ino(ae)",a);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'©',0x41c0,"AE_IFDIR | 0700",(ulong)mVar3,"archive_entry_mode(ae)",a);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'ª',0x4e489c23,"1313381411",tVar6,"archive_entry_mtime(ae)",a);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'«',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",a);
  mVar3 = archive_entry_perm(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¬',0x1c0,"0700",(ulong)mVar3,"archive_entry_perm(ae)",a);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'­',0x800,"2048",lVar8,"archive_entry_size(ae)",a);
  lVar8 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'®',0,"0",lVar8,"archive_entry_uid(ae)",a);
  pcVar5 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'¯',(char *)0x0,"NULL",pcVar5,"archive_entry_uname(ae)",a,L'\0');
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'´',"C/D","\"C/D\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'µ',0x4e489c23,"1313381411",tVar6,"archive_entry_atime(ae)",a);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¶',0,"0",tVar6,"archive_entry_birthtime(ae)",a);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'·',0x4e489c23,"1313381411",tVar6,"archive_entry_ctime(ae)",a);
  dVar7 = archive_entry_dev(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¸',0,"0",dVar7,"archive_entry_dev(ae)",a);
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¹',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",a);
  lVar8 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'º',0,"0",lVar8,"archive_entry_gid(ae)",a);
  pcVar5 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'»',(char *)0x0,"NULL",pcVar5,"archive_entry_gname(ae)",a,L'\0');
  lVar8 = archive_entry_ino(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¼',0,"0",lVar8,"archive_entry_ino(ae)",a);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'½',0x8100,"AE_IFREG | 0400",(ulong)mVar3,"archive_entry_mode(ae)",a);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¾',0x4e489c23,"1313381411",tVar6,"archive_entry_mtime(ae)",a);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'¿',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",a);
  mVar3 = archive_entry_perm(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'À',0x100,"0400",(ulong)mVar3,"archive_entry_perm(ae)",a);
  lVar8 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Á',6,"6",lVar8,"archive_entry_size(ae)",a);
  lVar8 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Â',0,"0",lVar8,"archive_entry_uid(ae)",a);
  pcVar5 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'Ã',(char *)0x0,"NULL",pcVar5,"archive_entry_uname(ae)",a,L'\0');
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'È',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'É',5,"5",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Ë',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Ì',(long)iVar1,"archive_format(a)",0x40000,"ARCHIVE_FORMAT_ISO9660",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Í',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Î',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Ï',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Ð',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_small(const char *name)
{
	struct archive_entry *ae;
	struct archive *a;

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, name, 512));

	/* Root directory */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_atime_is_set(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_birthtime_is_set(ae));
	assertEqualInt(0, archive_entry_birthtime(ae));
	assertEqualInt(0, archive_entry_ctime_is_set(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualIntA(a, 0, archive_entry_dev(ae));
	assertEqualIntA(a, AE_IFDIR, archive_entry_filetype(ae));
	assertEqualIntA(a, 0, archive_entry_gid(ae));
	assertEqualStringA(a, NULL, archive_entry_gname(ae));
	assertEqualIntA(a, 0, archive_entry_ino(ae));
	assertEqualIntA(a, AE_IFDIR | 0700, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_mtime_is_set(ae));
	assertEqualInt(0, archive_entry_mtime(ae));
	assertEqualIntA(a, 4, archive_entry_nlink(ae));
	assertEqualIntA(a, 0700, archive_entry_perm(ae));
	assertEqualIntA(a, 2048, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_entry_uid(ae));
	assertEqualStringA(a, NULL, archive_entry_uname(ae));

	/* Directory "A" */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("A", archive_entry_pathname(ae));
	assertEqualIntA(a, 1313381406, archive_entry_atime(ae));
	assertEqualIntA(a, 0, archive_entry_birthtime(ae));
	assertEqualIntA(a, 1313381406, archive_entry_ctime(ae));
	assertEqualIntA(a, 0, archive_entry_dev(ae));
	assertEqualIntA(a, AE_IFDIR, archive_entry_filetype(ae));
	assertEqualIntA(a, 0, archive_entry_gid(ae));
	assertEqualStringA(a, NULL, archive_entry_gname(ae));
	assertEqualIntA(a, 0, archive_entry_ino(ae));
	assertEqualIntA(a, AE_IFDIR | 0700, archive_entry_mode(ae));
	assertEqualIntA(a, 1313381406, archive_entry_mtime(ae));
	assertEqualIntA(a, 2, archive_entry_nlink(ae));
	assertEqualIntA(a, 0700, archive_entry_perm(ae));
	assertEqualIntA(a, 2048, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_entry_uid(ae));
	assertEqualStringA(a, NULL, archive_entry_uname(ae));

	/* File "A/B" */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("A/B", archive_entry_pathname(ae));
	assertEqualIntA(a, 1313381406, archive_entry_atime(ae));
	assertEqualIntA(a, 0, archive_entry_birthtime(ae));
	assertEqualIntA(a, 1313381406, archive_entry_ctime(ae));
	assertEqualIntA(a, 0, archive_entry_dev(ae));
	assertEqualIntA(a, AE_IFREG, archive_entry_filetype(ae));
	assertEqualIntA(a, 0, archive_entry_gid(ae));
	assertEqualStringA(a, NULL, archive_entry_gname(ae));
	assertEqualIntA(a, 0, archive_entry_ino(ae));
	assertEqualIntA(a, AE_IFREG | 0400, archive_entry_mode(ae));
	assertEqualIntA(a, 1313381406, archive_entry_mtime(ae));
	assertEqualIntA(a, 1, archive_entry_nlink(ae));
	assertEqualIntA(a, 0400, archive_entry_perm(ae));
	assertEqualIntA(a, 6, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_entry_uid(ae));
	assertEqualStringA(a, NULL, archive_entry_uname(ae));
	/* TODO: Verify that file contents are "hello\n" */

	/* Directory "C" */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("C", archive_entry_pathname(ae));
	assertEqualIntA(a, 1313381411, archive_entry_atime(ae));
	assertEqualIntA(a, 0, archive_entry_birthtime(ae));
	assertEqualIntA(a, 1313381411, archive_entry_ctime(ae));
	assertEqualIntA(a, 0, archive_entry_dev(ae));
	assertEqualIntA(a, AE_IFDIR, archive_entry_filetype(ae));
	assertEqualIntA(a, 0, archive_entry_gid(ae));
	assertEqualStringA(a, NULL, archive_entry_gname(ae));
	assertEqualIntA(a, 0, archive_entry_ino(ae));
	assertEqualIntA(a, AE_IFDIR | 0700, archive_entry_mode(ae));
	assertEqualIntA(a, 1313381411, archive_entry_mtime(ae));
	assertEqualIntA(a, 2, archive_entry_nlink(ae));
	assertEqualIntA(a, 0700, archive_entry_perm(ae));
	assertEqualIntA(a, 2048, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_entry_uid(ae));
	assertEqualStringA(a, NULL, archive_entry_uname(ae));

	/* File "C/D" */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("C/D", archive_entry_pathname(ae));
	assertEqualIntA(a, 1313381411, archive_entry_atime(ae));
	assertEqualIntA(a, 0, archive_entry_birthtime(ae));
	assertEqualIntA(a, 1313381411, archive_entry_ctime(ae));
	assertEqualIntA(a, 0, archive_entry_dev(ae));
	assertEqualIntA(a, AE_IFREG, archive_entry_filetype(ae));
	assertEqualIntA(a, 0, archive_entry_gid(ae));
	assertEqualStringA(a, NULL, archive_entry_gname(ae));
	assertEqualIntA(a, 0, archive_entry_ino(ae));
	assertEqualIntA(a, AE_IFREG | 0400, archive_entry_mode(ae));
	assertEqualIntA(a, 1313381411, archive_entry_mtime(ae));
	assertEqualIntA(a, 1, archive_entry_nlink(ae));
	assertEqualIntA(a, 0400, archive_entry_perm(ae));
	assertEqualIntA(a, 6, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_entry_uid(ae));
	assertEqualStringA(a, NULL, archive_entry_uname(ae));
	/* TODO: Verify that file contents are "hello\n" */

	/* Final statistics */
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_next_header(a, &ae));
	assertEqualInt(5, archive_file_count(a));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}